

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_neg(fe_loose *h,fe *f)

{
  int iVar1;
  uint local_20;
  uint local_1c;
  uint _assert_fe_i_1;
  uint _assert_fe_i;
  fe *f_local;
  fe_loose *h_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      fiat_25519_opp(h->v,f->v);
      local_20 = 0;
      while( true ) {
        if (4 < local_20) {
          return;
        }
        iVar1 = constant_time_declassify_int((uint)(h->v[local_20] < 0x1a666666666665));
        if (iVar1 == 0) break;
        local_20 = local_20 + 1;
      }
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0x117,"void fe_neg(fe_loose *, const fe *)");
    }
    iVar1 = constant_time_declassify_int((uint)(f->v[local_1c] < 0x8cccccccccccd));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0x115,"void fe_neg(fe_loose *, const fe *)");
}

Assistant:

static void fe_neg(fe_loose *h, const fe *f) {
  assert_fe(f->v);
  fiat_25519_opp(h->v, f->v);
  assert_fe_loose(h->v);
}